

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# point_attribute.cc
# Opt level: O1

ValueType __thiscall
draco::PointAttribute::DeduplicateFormattedValues<float,3>
          (PointAttribute *this,GeometryAttribute *in_att,AttributeValueIndex in_att_offset)

{
  uint uVar1;
  pointer puVar2;
  size_t __n;
  pointer pIVar3;
  size_type __new_size;
  long lVar4;
  iterator iVar5;
  ValueType VVar6;
  ulong uVar7;
  ulong uVar8;
  AttributeHashableValue hashable_value;
  IndexTypeVector<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>
  value_map;
  unordered_map<std::array<unsigned_int,_3UL>,_draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>,_draco::HashArray<std::array<unsigned_int,_3UL>_>,_std::equal_to<std::array<unsigned_int,_3UL>_>,_std::allocator<std::pair<const_std::array<unsigned_int,_3UL>,_draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>_>_>
  value_to_index_map;
  key_type local_b0;
  uint local_a0 [2];
  uint local_98;
  vector<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>_>
  local_90;
  allocator_type local_78 [8];
  uint local_70;
  uint local_6c;
  _Hashtable<std::array<unsigned_int,_3UL>,_std::pair<const_std::array<unsigned_int,_3UL>,_draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>,_std::allocator<std::pair<const_std::array<unsigned_int,_3UL>,_draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::array<unsigned_int,_3UL>_>,_draco::HashArray<std::array<unsigned_int,_3UL>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_68;
  
  local_68._M_buckets = &local_68._M_single_bucket;
  local_68._M_bucket_count = 1;
  local_68._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_68._M_element_count = 0;
  local_68._M_rehash_policy._M_max_load_factor = 1.0;
  local_68._M_rehash_policy._M_next_resize = 0;
  local_68._M_single_bucket = (__node_base_ptr)0x0;
  std::
  vector<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>_>
  ::vector(&local_90,(ulong)this->num_unique_entries_,local_78);
  __new_size = (size_type)this->num_unique_entries_;
  if (this->num_unique_entries_ == 0) {
    VVar6 = 0;
  }
  else {
    uVar8 = 0;
    VVar6 = 0;
    do {
      lVar4 = (ulong)((int)uVar8 + in_att_offset.value_) * in_att->byte_stride_;
      puVar2 = (in_att->buffer_->data_).
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start;
      local_b0._M_elems._0_8_ = *(undefined8 *)(puVar2 + lVar4 + in_att->byte_offset_);
      local_b0._M_elems[2] = *(uint *)(puVar2 + lVar4 + 8 + in_att->byte_offset_);
      local_a0 = (uint  [2])local_b0._M_elems._0_8_;
      local_98 = local_b0._M_elems[2];
      iVar5 = std::
              _Hashtable<std::array<unsigned_int,_3UL>,_std::pair<const_std::array<unsigned_int,_3UL>,_draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>,_std::allocator<std::pair<const_std::array<unsigned_int,_3UL>,_draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::array<unsigned_int,_3UL>_>,_draco::HashArray<std::array<unsigned_int,_3UL>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
              ::find(&local_68,&local_b0);
      if (iVar5.
          super__Node_iterator_base<std::pair<const_std::array<unsigned_int,_3UL>,_draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>,_true>
          ._M_cur == (__node_type *)0x0) {
        local_70 = local_b0._M_elems[2];
        local_78 = (allocator_type  [8])local_b0._M_elems._0_8_;
        local_6c = VVar6;
        std::
        _Hashtable<std::array<unsigned_int,3ul>,std::pair<std::array<unsigned_int,3ul>const,draco::IndexType<unsigned_int,draco::AttributeValueIndex_tag_type_>>,std::allocator<std::pair<std::array<unsigned_int,3ul>const,draco::IndexType<unsigned_int,draco::AttributeValueIndex_tag_type_>>>,std::__detail::_Select1st,std::equal_to<std::array<unsigned_int,3ul>>,draco::HashArray<std::array<unsigned_int,3ul>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
        ::
        _M_emplace<std::pair<std::array<unsigned_int,3ul>,draco::IndexType<unsigned_int,draco::AttributeValueIndex_tag_type_>>>
                  ((_Hashtable<std::array<unsigned_int,3ul>,std::pair<std::array<unsigned_int,3ul>const,draco::IndexType<unsigned_int,draco::AttributeValueIndex_tag_type_>>,std::allocator<std::pair<std::array<unsigned_int,3ul>const,draco::IndexType<unsigned_int,draco::AttributeValueIndex_tag_type_>>>,std::__detail::_Select1st,std::equal_to<std::array<unsigned_int,3ul>>,draco::HashArray<std::array<unsigned_int,3ul>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                    *)&local_68,local_78);
        __n = (this->super_GeometryAttribute).byte_stride_;
        memcpy((void *)(VVar6 * __n +
                       (long)(((this->super_GeometryAttribute).buffer_)->data_).
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_start),local_a0,__n);
        local_90.
        super__Vector_base<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>_>
        ._M_impl.super__Vector_impl_data._M_start[uVar8].value_ = VVar6;
        VVar6 = VVar6 + 1;
      }
      else {
        local_90.
        super__Vector_base<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>_>
        ._M_impl.super__Vector_impl_data._M_start[uVar8].value_ =
             *(uint *)((long)iVar5.
                             super__Node_iterator_base<std::pair<const_std::array<unsigned_int,_3UL>,_draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>,_true>
                             ._M_cur + 0x14);
      }
      uVar8 = uVar8 + 1;
      __new_size = (size_type)this->num_unique_entries_;
    } while (uVar8 < __new_size);
  }
  if (VVar6 != (ValueType)__new_size) {
    if (this->identity_mapping_ == false) {
      pIVar3 = (this->indices_map_).vector_.
               super__Vector_base<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar8 = (ulong)((long)(this->indices_map_).vector_.
                            super__Vector_base<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)pIVar3) >> 2;
      if ((int)uVar8 != 0) {
        uVar7 = 0;
        do {
          pIVar3[uVar7].value_ =
               local_90.
               super__Vector_base<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[pIVar3[uVar7].value_].value_;
          uVar7 = uVar7 + 1;
        } while ((uVar8 & 0xffffffff) != uVar7);
      }
    }
    else {
      this->identity_mapping_ = false;
      std::
      vector<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>_>
      ::resize(&(this->indices_map_).vector_,__new_size,(value_type *)&kInvalidAttributeValueIndex);
      uVar1 = this->num_unique_entries_;
      if ((ulong)uVar1 != 0) {
        pIVar3 = (this->indices_map_).vector_.
                 super__Vector_base<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        uVar8 = 0;
        do {
          pIVar3[uVar8].value_ =
               local_90.
               super__Vector_base<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar8].value_;
          uVar8 = uVar8 + 1;
        } while (uVar1 != uVar8);
      }
    }
    this->num_unique_entries_ = VVar6;
  }
  if (local_90.
      super__Vector_base<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_90.
                    super__Vector_base<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_90.
                          super__Vector_base<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_90.
                          super__Vector_base<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  std::
  _Hashtable<std::array<unsigned_int,_3UL>,_std::pair<const_std::array<unsigned_int,_3UL>,_draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>,_std::allocator<std::pair<const_std::array<unsigned_int,_3UL>,_draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::array<unsigned_int,_3UL>_>,_draco::HashArray<std::array<unsigned_int,_3UL>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&local_68);
  return VVar6;
}

Assistant:

AttributeValueIndex::ValueType PointAttribute::DeduplicateFormattedValues(
    const GeometryAttribute &in_att, AttributeValueIndex in_att_offset) {
  // We want to detect duplicates using a hash map but we cannot hash floating
  // point numbers directly so bit-copy floats to the same sized integers and
  // hash them.

  // First we need to determine which int type to use (1, 2, 4 or 8 bytes).
  // Note, this is done at compile time using std::conditional struct.
  // Conditional is in form <bool-expression, true, false>. If bool-expression
  // is true the "true" branch is used and vice versa. All at compile time.
  typedef conditional_t<sizeof(T) == 1, uint8_t,
                        conditional_t<sizeof(T) == 2, uint16_t,
                                      conditional_t<sizeof(T) == 4, uint32_t,
                                                    /*else*/ uint64_t>>>
      HashType;

  AttributeValueIndex unique_vals(0);
  typedef std::array<T, num_components_t> AttributeValue;
  typedef std::array<HashType, num_components_t> AttributeHashableValue;
  // Hash map storing index of the first attribute with a given value.
  unordered_map<AttributeHashableValue, AttributeValueIndex,
                HashArray<AttributeHashableValue>>
      value_to_index_map;
  AttributeValue att_value;
  AttributeHashableValue hashable_value;
  IndexTypeVector<AttributeValueIndex, AttributeValueIndex> value_map(
      num_unique_entries_);
  for (AttributeValueIndex i(0); i < num_unique_entries_; ++i) {
    const AttributeValueIndex att_pos = i + in_att_offset;
    att_value = in_att.GetValue<T, num_components_t>(att_pos);
    // Convert the value to hashable type. Bit-copy real attributes to integers.
    memcpy(&(hashable_value[0]), &(att_value[0]), sizeof(att_value));

    // Check if the given attribute value has been used before already.
    auto it = value_to_index_map.find(hashable_value);
    if (it != value_to_index_map.end()) {
      // Duplicated value found. Update index mapping.
      value_map[i] = it->second;
    } else {
      // New unique value.
      // Update the hash map with a new entry pointing to the latest unique
      // vertex index.
      value_to_index_map.insert(
          std::pair<AttributeHashableValue, AttributeValueIndex>(hashable_value,
                                                                 unique_vals));
      // Add the unique value to the mesh builder.
      SetAttributeValue(unique_vals, &att_value);
      // Update index mapping.
      value_map[i] = unique_vals;

      ++unique_vals;
    }
  }
  if (unique_vals == num_unique_entries_) {
    return unique_vals.value();  // Nothing has changed.
  }
  if (is_mapping_identity()) {
    // Change identity mapping to the explicit one.
    // The number of points is equal to the number of old unique values.
    SetExplicitMapping(num_unique_entries_);
    // Update the explicit map.
    for (uint32_t i = 0; i < num_unique_entries_; ++i) {
      SetPointMapEntry(PointIndex(i), value_map[AttributeValueIndex(i)]);
    }
  } else {
    // Update point to value map using the mapping between old and new values.
    for (PointIndex i(0); i < static_cast<uint32_t>(indices_map_.size()); ++i) {
      SetPointMapEntry(i, value_map[indices_map_[i]]);
    }
  }
  num_unique_entries_ = unique_vals.value();
  return num_unique_entries_;
}